

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p16_lexer.cpp
# Opt level: O1

void yy_switch_to_buffer(YY_BUFFER_STATE new_buffer)

{
  YY_BUFFER_STATE *ppyVar1;
  size_t sVar2;
  YY_BUFFER_STATE pyVar3;
  
  yyensure_buffer_stack();
  sVar2 = yy_buffer_stack_top;
  ppyVar1 = yy_buffer_stack;
  if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
    pyVar3 = (YY_BUFFER_STATE)0x0;
  }
  else {
    pyVar3 = yy_buffer_stack[yy_buffer_stack_top];
  }
  if (pyVar3 != new_buffer) {
    if ((yy_buffer_stack != (YY_BUFFER_STATE *)0x0) &&
       (yy_buffer_stack[yy_buffer_stack_top] != (YY_BUFFER_STATE)0x0)) {
      *yy_c_buf_p = yy_hold_char;
      ppyVar1[sVar2]->yy_buf_pos = yy_c_buf_p;
      ppyVar1[sVar2]->yy_n_chars = yy_n_chars;
    }
    sVar2 = yy_buffer_stack_top;
    ppyVar1[yy_buffer_stack_top] = new_buffer;
    yy_n_chars = new_buffer->yy_n_chars;
    yytext = new_buffer->yy_buf_pos;
    yyin = ppyVar1[sVar2]->yy_input_file;
    yy_hold_char = *yytext;
    yy_c_buf_p = yytext;
  }
  return;
}

Assistant:

void yy_switch_to_buffer  (YY_BUFFER_STATE  new_buffer )
{
    
	/* TODO. We should be able to replace this entire function body
	 * with
	 *		yypop_buffer_state();
	 *		yypush_buffer_state(new_buffer);
     */
	yyensure_buffer_stack ();
	if ( YY_CURRENT_BUFFER == new_buffer )
		return;

	if ( YY_CURRENT_BUFFER )
		{
		/* Flush out information for old buffer. */
		*(yy_c_buf_p) = (yy_hold_char);
		YY_CURRENT_BUFFER_LVALUE->yy_buf_pos = (yy_c_buf_p);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars);
		}

	YY_CURRENT_BUFFER_LVALUE = new_buffer;
	yy_load_buffer_state(  );

	/* We don't actually know whether we did this switch during
	 * EOF (yywrap()) processing, but the only time this flag
	 * is looked at is after yywrap() is called, so it's safe
	 * to go ahead and always set it.
	 */
	(yy_did_buffer_switch_on_eof) = 1;
}